

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_ptr_queue.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::
try_wakeup_someone_if_possible
          (mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *this_local;
  
  bVar1 = std::
          deque<so_5::disp::adv_thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t_*>_>
          ::empty(&this->m_queue);
  if (((!bVar1) &&
      (bVar1 = std::
               vector<so_5::disp::mpmc_queue_traits::condition_t_*,_std::allocator<so_5::disp::mpmc_queue_traits::condition_t_*>_>
               ::empty(&this->m_waiting_customers), !bVar1)) &&
     ((this->m_wakeup_in_progress & 1U) == 0)) {
    sVar2 = std::
            deque<so_5::disp::adv_thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t_*>_>
            ::size(&this->m_queue);
    if ((sVar2 <= this->m_next_thread_wakeup_threshold) &&
       (sVar2 = this->m_max_thread_count,
       sVar3 = std::
               vector<so_5::disp::mpmc_queue_traits::condition_t_*,_std::allocator<so_5::disp::mpmc_queue_traits::condition_t_*>_>
               ::size(&this->m_waiting_customers), sVar2 != sVar3)) {
      return;
    }
    pop_and_notify_one_waiting_customer(this);
  }
  return;
}

Assistant:

void
		try_wakeup_someone_if_possible()
			{
				if( !m_queue.empty() &&
						!m_waiting_customers.empty() &&
						!m_wakeup_in_progress &&
						( m_queue.size() > m_next_thread_wakeup_threshold ||
						m_max_thread_count == m_waiting_customers.size() ) )
					pop_and_notify_one_waiting_customer();
			}